

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O1

void __thiscall
Pl_DCT::Pl_DCT(Pl_DCT *this,char *identifier,Pipeline *next,JDIMENSION image_width,
              JDIMENSION image_height,int components,J_COLOR_SPACE color_space,
              CompressConfig *compress_callback)

{
  Members *pMVar1;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_DCT_002f03c8;
  pMVar1 = (Members *)operator_new(0x58);
  pMVar1->action = a_compress;
  Pl_Buffer::Pl_Buffer(&pMVar1->buf,"DCT uncompressed image",(Pipeline *)0x0);
  pMVar1->image_width = image_width;
  pMVar1->image_height = image_height;
  pMVar1->components = components;
  pMVar1->color_space = color_space;
  pMVar1->config_callback = compress_callback;
  (this->m)._M_t.super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
  super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl = pMVar1;
  return;
}

Assistant:

Pl_DCT::Pl_DCT(
    char const* identifier,
    Pipeline* next,
    JDIMENSION image_width,
    JDIMENSION image_height,
    int components,
    J_COLOR_SPACE color_space,
    CompressConfig* compress_callback) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(
        image_width, image_height, components, color_space, compress_callback))
{
}